

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O2

IRIns * lj_snap_regspmap(jit_State *J,GCtrace *T,SnapNo snapno,IRIns *ir)

{
  uint uVar1;
  SnapEntry *pSVar2;
  long lVar3;
  ushort uVar4;
  BloomFilter BVar6;
  uint ref;
  ulong uVar7;
  RegSP RVar5;
  
  uVar1 = T->snap[snapno].mapofs;
  pSVar2 = T->snapmap;
  BVar6 = snap_renamefilter(T,snapno);
  uVar7 = 0;
  do {
    if ((ir->field_1).o == '\x0e') {
      ref = (ir->field_0).op1 + 0x8000;
    }
    else {
      if (((ir->field_1).o != 'G') || (((ir->field_0).op2 & 1) == 0)) {
        return ir;
      }
      do {
        lVar3 = uVar1 + uVar7;
        uVar7 = (ulong)((int)uVar7 + 1);
      } while (pSVar2[lVar3] >> 0x18 != (uint)(ir->field_0).op1);
      ref = pSVar2[lVar3] & 0xffff;
    }
    uVar4 = *(ushort *)((long)T->ir + (ulong)ref * 8 + 6);
    if ((BVar6 >> ((ulong)ref & 0x3f) & 1) != 0) {
      RVar5 = snap_renameref(T,snapno,ref,(uint)uVar4);
      uVar4 = (ushort)RVar5;
    }
    (ir->field_0).prev = uVar4;
    ir = ir + 1;
  } while( true );
}

Assistant:

IRIns *lj_snap_regspmap(jit_State *J, GCtrace *T, SnapNo snapno, IRIns *ir)
{
  SnapShot *snap = &T->snap[snapno];
  SnapEntry *map = &T->snapmap[snap->mapofs];
  BloomFilter rfilt = snap_renamefilter(T, snapno);
  MSize n = 0;
  IRRef ref = 0;
  UNUSED(J);
  for ( ; ; ir++) {
    uint32_t rs;
    if (ir->o == IR_SLOAD) {
      if (!(ir->op2 & IRSLOAD_PARENT)) break;
      for ( ; ; n++) {
	lj_assertJ(n < snap->nent, "slot %d not found in snapshot", ir->op1);
	if (snap_slot(map[n]) == ir->op1) {
	  ref = snap_ref(map[n++]);
	  break;
	}
      }
    } else if (LJ_SOFTFP32 && ir->o == IR_HIOP) {
      ref++;
    } else if (ir->o == IR_PVAL) {
      ref = ir->op1 + REF_BIAS;
    } else {
      break;
    }
    rs = T->ir[ref].prev;
    if (bloomtest(rfilt, ref))
      rs = snap_renameref(T, snapno, ref, rs);
    ir->prev = (uint16_t)rs;
    lj_assertJ(regsp_used(rs), "unused IR %04d in snapshot", ref - REF_BIAS);
  }
  return ir;
}